

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void parasail_result_free(parasail_result_t *result)

{
  parasail_result_t *result_local;
  
  if (result == (parasail_result_t *)0x0) {
    fprintf(_stderr,"%s: attempted free of NULL result pointer\n","parasail_result_free");
  }
  else {
    if ((result->flag & 0x10000U) == 0) {
      if ((result->flag & 0x20000U) != 0) {
        free(((result->field_4).trace)->trace_table);
        free((result->field_4).extra);
      }
      if ((result->flag & 0x40000U) != 0) {
        free(((result->field_4).trace)->trace_table);
        free(((result->field_4).trace)->trace_ins_table);
        free((result->field_4).extra);
      }
    }
    else {
      if ((result->flag & 0x20000U) != 0) {
        free(*((result->field_4).trace)->trace_del_table);
        free(*(void **)((long)((result->field_4).trace)->trace_del_table + 8));
        free(*(void **)((long)((result->field_4).trace)->trace_del_table + 0x10));
        free(*(void **)((long)((result->field_4).trace)->trace_del_table + 0x18));
        free(((result->field_4).trace)->trace_del_table);
      }
      if ((result->flag & 0x40000U) != 0) {
        free(*((result->field_4).trace)->trace_del_table);
        free(*(void **)((long)((result->field_4).trace)->trace_del_table + 8));
        free(*(void **)((long)((result->field_4).trace)->trace_del_table + 0x10));
        free(*(void **)((long)((result->field_4).trace)->trace_del_table + 0x18));
        free(*(void **)((long)((result->field_4).trace)->trace_del_table + 0x20));
        free(*(void **)((long)((result->field_4).trace)->trace_del_table + 0x28));
        free(*(void **)((long)((result->field_4).trace)->trace_del_table + 0x30));
        free(*(void **)((long)((result->field_4).trace)->trace_del_table + 0x38));
        free(((result->field_4).trace)->trace_del_table);
      }
      free((result->field_4).extra);
    }
    if ((result->flag & 0x80000U) != 0) {
      parasail_free(((result->field_4).trace)->trace_table);
      if (((result->field_4).rowcols)->score_col != (int *)0x0) {
        parasail_free(((result->field_4).trace)->trace_ins_table);
      }
      if (((result->field_4).trace)->trace_del_table != (void *)0x0) {
        parasail_free(((result->field_4).trace)->trace_del_table);
      }
      free((result->field_4).extra);
    }
    free(result);
  }
  return;
}

Assistant:

void parasail_result_free(parasail_result_t *result)
{
    /* validate inputs */
    if (!result) {
        fprintf(stderr, "%s: attempted free of NULL result pointer\n", __func__);
        return;
    }
    
    if (result->flag & PARASAIL_FLAG_STATS) {
        if (result->flag & PARASAIL_FLAG_TABLE) {
            free(result->stats->tables->score_table);
            free(result->stats->tables->matches_table);
            free(result->stats->tables->similar_table);
            free(result->stats->tables->length_table);
            free(result->stats->tables);
        }
        if (result->flag & PARASAIL_FLAG_ROWCOL) {
            free(result->stats->rowcols->score_row);
            free(result->stats->rowcols->matches_row);
            free(result->stats->rowcols->similar_row);
            free(result->stats->rowcols->length_row);
            free(result->stats->rowcols->score_col);
            free(result->stats->rowcols->matches_col);
            free(result->stats->rowcols->similar_col);
            free(result->stats->rowcols->length_col);
            free(result->stats->rowcols);
        }
        free(result->stats);
    }
    else {
        if (result->flag & PARASAIL_FLAG_TABLE) {
            free(result->tables->score_table);
            free(result->tables);
        }
        if (result->flag & PARASAIL_FLAG_ROWCOL) {
            free(result->rowcols->score_row);
            free(result->rowcols->score_col);
            free(result->rowcols);
        }
    }
    if (result->flag & PARASAIL_FLAG_TRACE) {
        parasail_free(result->trace->trace_table);
        if (NULL != result->trace->trace_ins_table)
            parasail_free(result->trace->trace_ins_table);
        if (NULL != result->trace->trace_del_table)
            parasail_free(result->trace->trace_del_table);
        free(result->trace);
    }

    free(result);
}